

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_for_each.cpp
# Opt level: O2

void range_based_for_each_index<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint w)

{
  code *pcVar1;
  double dVar2;
  GuidedPartitioner<tf::DefaultClosureWrapper> part;
  char extraout_AL;
  char extraout_AL_00;
  ulong uVar3;
  int iVar4;
  anon_class_8_1_bc7188dc c;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  Enum EVar8;
  Executor *this;
  long lVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  IndexRange<int> range;
  undefined4 uStack_348;
  int local_344;
  atomic<unsigned_long> counter;
  Expression_lhs<const_unsigned_long_&> local_328;
  size_t n;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ulong local_2f8;
  long local_2f0;
  unsigned_long *local_2e8;
  ResultBuilder DOCTEST_RB;
  shared_ptr<tf::WorkerInterface> local_268;
  Result local_250;
  Taskflow taskflow;
  Executor executor;
  
  local_268.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_268.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  uVar3 = 10;
  local_344 = 0x16;
  do {
    if ((int)uVar3 < -10) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    uVar6 = uVar3;
    local_310 = uVar3;
    local_300 = uVar3;
    for (iVar7 = 1; iVar7 != local_344; iVar7 = iVar7 + 1) {
      local_2f0 = (uVar6 << 0x20) + local_310;
      uVar5 = 1;
      local_308 = uVar6;
      while( true ) {
        iVar4 = (int)uVar5;
        if (iVar4 == iVar7) break;
        n = (size_t)((((int)uVar6 + 1) - (iVar4 + (int)uVar3)) / -iVar4);
        local_2f8 = uVar5;
        local_2e8 = (unsigned_long *)n;
        for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
          std::
          vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ::clear(&taskflow._graph.
                   super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 );
          LOCK();
          counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
          UNLOCK();
          DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
          DOCTEST_RB.super_AssertData._71_2_ = 0x17;
          DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
          DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20)
          ;
          EVar8 = DT_REQUIRE;
          DOCTEST_RB.super_AssertData.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
          ;
          DOCTEST_RB.super_AssertData.m_line = 0x27c;
          DOCTEST_RB.super_AssertData.m_expr = "range.size() == n";
          DOCTEST_RB.super_AssertData.m_failed = true;
          DOCTEST_RB.super_AssertData.m_threw = false;
          DOCTEST_RB.super_AssertData.m_threw_as = false;
          DOCTEST_RB.super_AssertData.m_exception_type = "";
          DOCTEST_RB.super_AssertData.m_exception_string = "";
          local_328.lhs = local_2e8;
          local_328.m_at = EVar8;
          DOCTEST_RB.super_AssertData.m_at = EVar8;
          doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
                    (&local_250,(Expression_lhs<const_unsigned_long> *)&local_328,&n);
          doctest::detail::ResultBuilder::setResult
                    ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_250);
          doctest::String::~String(&local_250.m_decomp);
          dVar2 = doctest::detail::ResultBuilder::log
                            ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                             (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          if (extraout_AL != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
          doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
          c.counter._4_4_ = 0;
          c.counter._0_4_ = -iVar4;
          part.super_PartitionerBase<tf::DefaultClosureWrapper>._chunk_size._4_4_ = local_344;
          part.super_PartitionerBase<tf::DefaultClosureWrapper>._chunk_size._0_4_ = uStack_348;
          part.super_PartitionerBase<tf::DefaultClosureWrapper>._8_8_ =
               counter.super___atomic_base<unsigned_long>._M_i;
          range._step_size = (int)local_2f0;
          range._0_8_ = &taskflow;
          tf::FlowBuilder::
          for_each_by_index<tf::IndexRange<int>,range_based_for_each_index<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<int>)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
                    ((FlowBuilder *)&DOCTEST_RB.super_AssertData,range,c,part);
          this = &executor;
          tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
          std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this)
          ;
          tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
          DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
          DOCTEST_RB.super_AssertData._71_2_ = 0x17;
          DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
          DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20)
          ;
          DOCTEST_RB.super_AssertData.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
          ;
          DOCTEST_RB.super_AssertData.m_line = 0x287;
          DOCTEST_RB.super_AssertData.m_expr = "n == counter";
          DOCTEST_RB.super_AssertData.m_failed = true;
          DOCTEST_RB.super_AssertData.m_threw = false;
          DOCTEST_RB.super_AssertData.m_threw_as = false;
          DOCTEST_RB.super_AssertData.m_exception_type = "";
          DOCTEST_RB.super_AssertData.m_exception_string = "";
          local_328.lhs = &n;
          local_328.m_at = EVar8;
          DOCTEST_RB.super_AssertData.m_at = EVar8;
          doctest::detail::Expression_lhs<const_unsigned_long_&>::
          operator==<std::atomic<unsigned_long>,_nullptr>(&local_250,&local_328,&counter);
          doctest::detail::ResultBuilder::setResult
                    ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_250);
          doctest::String::~String(&local_250.m_decomp);
          dVar2 = doctest::detail::ResultBuilder::log
                            ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                             (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          if (extraout_AL_00 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
          doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
        }
        uVar5 = (ulong)((int)local_2f8 + 1);
        uVar3 = local_300;
      }
      uVar6 = (ulong)((int)local_308 - 1);
    }
    uVar3 = (ulong)((int)uVar3 - 1);
    local_344 = local_344 + -1;
  } while( true );
}

Assistant:

void range_based_for_each_index(unsigned w) {    
  tf::Executor executor(w);
  tf::Taskflow taskflow;
  std::atomic<size_t> counter {0};

  for(int beg=10; beg>=-10; --beg) {
    for(int end=beg; end>=-10; --end) {
      for(int s=1; s<=beg-end; ++s) {

        size_t n = tf::distance(beg, end, -s);

        for(size_t c=0; c<10; c++) {
          taskflow.clear();
          counter = 0;

          tf::IndexRange range(beg, end, -s);
          REQUIRE(range.size() == n);

          taskflow.for_each_by_index(range, [&] (tf::IndexRange<int> lrange) {
            size_t l = 0;
            for(auto j=lrange.begin(); j>lrange.end(); j+=lrange.step_size()) {
              l++;
            }
            REQUIRE(lrange.size() == l);
            counter.fetch_add(l, std::memory_order_relaxed);
          }, P(c));
          executor.run(taskflow).wait();
          REQUIRE(n == counter);
        }
      }
    }
  }
}